

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O2

uint32_t __thiscall
Bitmap::drawBarcode(Bitmap *this,uint32_t x,uint32_t y,uint32_t weight,uint32_t height,
                   uint32_t value)

{
  byte bVar1;
  uint32_t uVar2;
  int32_t pixel;
  uint uVar3;
  uint32_t uVar4;
  bool bVar5;
  uint8_t barcode [9];
  byte local_39 [9];
  
  if (height == 0) {
    uVar2 = 0;
  }
  else {
    uVar2 = BarcodeEan8::intToBarcode(value,local_39);
    for (uVar3 = 0; uVar3 != uVar2; uVar3 = uVar3 + 1) {
      bVar1 = local_39[uVar3 >> 3];
      uVar4 = weight;
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        pixel = getPixelIndex(this,x,y);
        setPixelValue(this,pixel,(0x80U >> ((byte)uVar3 & 7) & (uint)bVar1) != 0);
        x = x + 1;
      }
    }
    duplicateLineDown(this,y,height - 1);
    uVar2 = uVar2 * weight;
  }
  return uVar2;
}

Assistant:

uint32_t Bitmap::drawBarcode(uint32_t x, uint32_t y, uint32_t weight, uint32_t height, uint32_t value)
{
   if (height > 0)
   {
      uint8_t barcode[9];
      uint32_t barcodeLength;
      uint32_t cursor;
      uint32_t pixel;

      //get encode barcode
      barcodeLength = BarcodeEan8::intToBarcode(value, barcode);
      //draw one barcode line
      cursor = x;
      for (uint32_t i = 0; i < barcodeLength; ++i)
      {
         bool value = ((barcode[i/8] & (0x80 >> (i & 7))) != 0); //get respective bit
         for (uint32_t j = 0; j < weight; ++j)
         {
            pixel = getPixelIndex(cursor++, y);
            setPixelValue(pixel, value);
         }
      }

      //duplicate that line (height - 1)-times
      duplicateLineDown(y, height - 1);
      return weight * barcodeLength;
   }
   return 0;
}